

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkBinaryRegistry.cpp
# Opt level: O0

void __thiscall
vk::BinaryRegistryDetail::BinaryRegistryWriter::addProgram
          (BinaryRegistryWriter *this,ProgramIdentifier *id,ProgramBinary *binary)

{
  reference pvVar1;
  deUint32 local_94;
  ProgramIdentifierIndex local_78;
  deUint32 local_2c;
  deUint32 *pdStack_28;
  deUint32 index;
  deUint32 *indexPtr;
  ProgramBinary *binary_local;
  ProgramIdentifier *id_local;
  BinaryRegistryWriter *this_local;
  
  indexPtr = &binary->m_format;
  binary_local = (ProgramBinary *)id;
  id_local = (ProgramIdentifier *)this;
  pdStack_28 = findBinary(this,binary);
  if (pdStack_28 == (deUint32 *)0x0) {
    local_94 = 0xffffffff;
  }
  else {
    local_94 = *pdStack_28;
  }
  local_2c = local_94;
  if (pdStack_28 == (deUint32 *)0x0) {
    local_2c = getNextSlot(this);
    addBinary(this,local_2c,(ProgramBinary *)indexPtr);
  }
  pvVar1 = std::
           vector<vk::BinaryRegistryDetail::BinaryRegistryWriter::BinarySlot,_std::allocator<vk::BinaryRegistryDetail::BinaryRegistryWriter::BinarySlot>_>
           ::operator[](&this->m_binaries,(ulong)local_2c);
  pvVar1->referenceCount = pvVar1->referenceCount + 1;
  ProgramIdentifierIndex::ProgramIdentifierIndex
            (&local_78,(ProgramIdentifier *)binary_local,local_2c);
  std::
  vector<vk::BinaryRegistryDetail::ProgramIdentifierIndex,_std::allocator<vk::BinaryRegistryDetail::ProgramIdentifierIndex>_>
  ::push_back(&this->m_binaryIndices,&local_78);
  ProgramIdentifierIndex::~ProgramIdentifierIndex(&local_78);
  return;
}

Assistant:

void BinaryRegistryWriter::addProgram (const ProgramIdentifier& id, const ProgramBinary& binary)
{
	const deUint32* const	indexPtr	= findBinary(binary);
	deUint32				index		= indexPtr ? *indexPtr : ~0u;

	if (!indexPtr)
	{
		index = getNextSlot();
		addBinary(index, binary);
	}

	m_binaries[index].referenceCount += 1;
	m_binaryIndices.push_back(ProgramIdentifierIndex(id, index));
}